

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O2

void mzd_addmul_v_uint64_30_192(mzd_local_t *c,mzd_local_t *v,mzd_local_t *A)

{
  long lVar1;
  ulong uVar2;
  
  uVar2 = v->w64[2] >> 0x22;
  for (lVar1 = 0; (int)lVar1 != 0x3c0; lVar1 = lVar1 + 0x20) {
    mzd_xor_mask_uint64_block(c,(block_t *)((long)A->w64 + lVar1),-(ulong)((uint)uVar2 & 1),3);
    uVar2 = uVar2 >> 1;
  }
  return;
}

Assistant:

void mzd_addmul_v_uint64_30_192(mzd_local_t* c, mzd_local_t const* v, mzd_local_t const* A) {
  block_t* cblock       = BLOCK(c, 0);
  const block_t* Ablock = CONST_BLOCK(A, 0);

  word idx = CONST_BLOCK(v, 0)->w64[2] >> 34;
  for (unsigned int i = 30; i; --i, idx >>= 1, ++Ablock) {
    const word mask = -(idx & 1);
    mzd_xor_mask_uint64_block(cblock, Ablock, mask, 3);
  }
}